

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LIRMIA3.h
# Opt level: O2

int WriteDataLIRMIA3(LIRMIA3 *pLIRMIA3,uchar M1,uchar M2,uchar M3,uchar M4)

{
  int iVar1;
  uchar sendbuf [256];
  
  memset(sendbuf,0,0x100);
  sendbuf[0] = 'T';
  sendbuf[1] = '\x04';
  sendbuf[2] = '\x04';
  sendbuf[3] = M1;
  sendbuf[4] = M2;
  sendbuf[5] = M3;
  sendbuf[6] = M4;
  iVar1 = WriteAllRS232Port(&pLIRMIA3->RS232Port,sendbuf,7);
  if (iVar1 == 0) {
    if ((pLIRMIA3->bSaveRawData != 0) && ((FILE *)pLIRMIA3->pfSaveFile != (FILE *)0x0)) {
      fwrite(sendbuf,7,1,(FILE *)pLIRMIA3->pfSaveFile);
      fflush((FILE *)pLIRMIA3->pfSaveFile);
    }
    mSleep(10);
    iVar1 = 0;
  }
  else {
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

inline int WriteDataLIRMIA3(LIRMIA3* pLIRMIA3, unsigned char M1, unsigned char M2, unsigned char M3, unsigned char M4)
{
	unsigned char sendbuf[MAX_NB_BYTES_LIRMIA3];
	int sendbuflen = 0;

	// Prepare data to send to device.
	memset(sendbuf, 0, sizeof(sendbuf));
	sendbuf[0] = (unsigned char)0x54; // Read or Write multiple bytes for devices without internal address or where address does not require resetting.
	sendbuf[1] = (unsigned char)0x04; // I2C address
	sendbuf[2] = (unsigned char)0x04; // Number of bytes to write
	sendbuf[3] = M1;
	sendbuf[4] = M2;
	sendbuf[5] = M3;
	sendbuf[6] = M4;
	sendbuflen = 7;
	
	if (WriteAllRS232Port(&pLIRMIA3->RS232Port, (unsigned char*)sendbuf, sendbuflen) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}
	if ((pLIRMIA3->bSaveRawData)&&(pLIRMIA3->pfSaveFile))
	{
		fwrite(sendbuf, sendbuflen, 1, pLIRMIA3->pfSaveFile);
		fflush(pLIRMIA3->pfSaveFile);
	}

	mSleep(10);

	return EXIT_SUCCESS;
}